

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableMethodsGroupWalker::AddItem
          (RecyclableMethodsGroupWalker *this,PropertyId propertyId,Var obj)

{
  code *pcVar1;
  bool bVar2;
  ArenaAllocator *pAVar3;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar4;
  undefined4 *puVar5;
  DebuggerPropertyDisplayInfo *local_30;
  DebuggerPropertyDisplayInfo *info;
  
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pAVar3 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar4 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(pAVar3,4);
    (this->super_RecyclableObjectWalker).pMembersList = pLVar4;
    if (pLVar4 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xf38,"(pMembersList)","pMembersList");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  pAVar3 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  local_30 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,pAVar3,0x35916e);
  local_30->propId = propertyId;
  local_30->aVar = obj;
  local_30->flags = 1;
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add((this->super_RecyclableObjectWalker).pMembersList,&local_30);
  return;
}

Assistant:

void RecyclableMethodsGroupWalker::AddItem(Js::PropertyId propertyId, Var obj)
    {
        if (pMembersList == nullptr)
        {
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
        }

        Assert(pMembersList);

        DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, propertyId, obj, DebuggerPropertyDisplayInfoFlags_Const);
        Assert(info);
        pMembersList->Add(info);
    }